

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

void dec_buf_mgr_deinit(DecBufMgr mgr)

{
  uint local_1c;
  RK_U32 i;
  DecBufMgrImpl *impl;
  DecBufMgr mgr_local;
  
  if (mgr != (DecBufMgr)0x0) {
    if (*(long *)((long)mgr + 0x10) != 0) {
      mpp_buffer_group_put(*(undefined8 *)((long)mgr + 0x10));
      *(undefined8 *)((long)mgr + 0x10) = 0;
    }
    if ((*(int *)((long)mgr + 4) != 0) && (*(long *)((long)mgr + 0x18) != 0)) {
      for (local_1c = 0; local_1c < *(uint *)((long)mgr + 4); local_1c = local_1c + 1) {
        if (*(long *)(*(long *)((long)mgr + 0x18) + (ulong)local_1c * 8) != 0) {
          mpp_buffer_put_with_caller
                    (*(undefined8 *)(*(long *)((long)mgr + 0x18) + (ulong)local_1c * 8),
                     "dec_buf_mgr_deinit");
          *(undefined8 *)(*(long *)((long)mgr + 0x18) + (ulong)local_1c * 8) = 0;
        }
      }
      if (*(long *)((long)mgr + 0x18) != 0) {
        mpp_osal_free("dec_buf_mgr_deinit",*(undefined8 *)((long)mgr + 0x18));
      }
      *(undefined8 *)((long)mgr + 0x18) = 0;
    }
    if (mgr != (DecBufMgr)0x0) {
      mpp_osal_free("dec_buf_mgr_deinit",mgr);
    }
  }
  return;
}

Assistant:

void dec_buf_mgr_deinit(DecBufMgr mgr)
{
    DecBufMgrImpl *impl = (DecBufMgrImpl *)mgr;

    if (NULL == impl)
        return;

    /* release buffer group for half internal and external mode */
    if (impl->group) {
        mpp_buffer_group_put(impl->group);
        impl->group = NULL;
    }

    /* release the buffers used in external mode */
    if (impl->buf_count && impl->bufs) {
        RK_U32 i;

        for (i = 0; i < impl->buf_count; i++) {
            if (impl->bufs[i]) {
                mpp_buffer_put(impl->bufs[i]);
                impl->bufs[i] = NULL;
            }
        }

        MPP_FREE(impl->bufs);
    }

    MPP_FREE(impl);
}